

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ManSetCioIds(Aig_Man_t *p)

{
  int *piVar1;
  int i;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < p->vCis->nSize; iVar2 = iVar2 + 1) {
    piVar1 = (int *)Vec_PtrEntry(p->vCis,iVar2);
    *piVar1 = iVar2;
  }
  for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
    piVar1 = (int *)Vec_PtrEntry(p->vCos,iVar2);
    *piVar1 = iVar2;
  }
  return;
}

Assistant:

void Aig_ManSetCioIds( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachCi( p, pObj, i )
        pObj->CioId = i;
    Aig_ManForEachCo( p, pObj, i )
        pObj->CioId = i;
}